

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlCtxtReadMemory(void)

{
  int iVar1;
  int iVar2;
  int val;
  htmlParserCtxtPtr val_00;
  char *__s;
  char *val_01;
  char *val_02;
  size_t sVar3;
  htmlDocPtr val_03;
  int local_64;
  int n_options;
  int options;
  int n_encoding;
  char *encoding;
  int n_URL;
  char *URL;
  int n_size;
  int size;
  int n_buffer;
  char *buffer;
  int n_ctxt;
  htmlParserCtxtPtr ctxt;
  htmlDocPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (buffer._4_4_ = 0; (int)buffer._4_4_ < 3; buffer._4_4_ = buffer._4_4_ + 1) {
    for (n_size = 0; n_size < 4; n_size = n_size + 1) {
      for (URL._4_4_ = 0; (int)URL._4_4_ < 4; URL._4_4_ = URL._4_4_ + 1) {
        for (encoding._4_4_ = 0; (int)encoding._4_4_ < 8; encoding._4_4_ = encoding._4_4_ + 1) {
          for (n_options = 0; n_options < 4; n_options = n_options + 1) {
            for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
              iVar1 = xmlMemBlocks();
              val_00 = gen_htmlParserCtxtPtr(buffer._4_4_,0);
              __s = gen_const_char_ptr(n_size,1);
              iVar2 = gen_int(URL._4_4_,2);
              val_01 = gen_filepath(encoding._4_4_,3);
              val_02 = gen_const_char_ptr(n_options,4);
              val = gen_int(local_64,5);
              if ((__s == (char *)0x0) || (sVar3 = strlen(__s), iVar2 <= (int)sVar3 + 1)) {
                val_03 = (htmlDocPtr)htmlCtxtReadMemory(val_00,__s,iVar2,val_01,val_02,val);
                desret_htmlDocPtr(val_03);
                call_tests = call_tests + 1;
                des_htmlParserCtxtPtr(buffer._4_4_,val_00,0);
                des_const_char_ptr(n_size,__s,1);
                des_int(URL._4_4_,iVar2,2);
                des_filepath(encoding._4_4_,val_01,3);
                des_const_char_ptr(n_options,val_02,4);
                des_int(local_64,val,5);
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlCtxtReadMemory",
                         (ulong)(uint)(iVar2 - iVar1));
                  ret_val._4_4_ = ret_val._4_4_ + 1;
                  printf(" %d",(ulong)buffer._4_4_);
                  printf(" %d",(ulong)(uint)n_size);
                  printf(" %d",(ulong)URL._4_4_);
                  printf(" %d",(ulong)encoding._4_4_);
                  printf(" %d",(ulong)(uint)n_options);
                  printf(" %d");
                  printf("\n");
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlCtxtReadMemory(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlDocPtr ret_val;
    htmlParserCtxtPtr ctxt; /* an HTML parser context */
    int n_ctxt;
    char * buffer; /* a pointer to a char array */
    int n_buffer;
    int size; /* the size of the array */
    int n_size;
    const char * URL; /* the base URL to use for the document */
    int n_URL;
    char * encoding; /* the document encoding, or NULL */
    int n_encoding;
    int options; /* a combination of htmlParserOption(s) */
    int n_options;

    for (n_ctxt = 0;n_ctxt < gen_nb_htmlParserCtxtPtr;n_ctxt++) {
    for (n_buffer = 0;n_buffer < gen_nb_const_char_ptr;n_buffer++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
    for (n_URL = 0;n_URL < gen_nb_filepath;n_URL++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_options = 0;n_options < gen_nb_int;n_options++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_htmlParserCtxtPtr(n_ctxt, 0);
        buffer = gen_const_char_ptr(n_buffer, 1);
        size = gen_int(n_size, 2);
        URL = gen_filepath(n_URL, 3);
        encoding = gen_const_char_ptr(n_encoding, 4);
        options = gen_int(n_options, 5);
        if ((buffer != NULL) &&
            (size > (int) strlen((const char *) buffer) + 1))
            continue;

        ret_val = htmlCtxtReadMemory(ctxt, (const char *)buffer, size, URL, (const char *)encoding, options);
        desret_htmlDocPtr(ret_val);
        call_tests++;
        des_htmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_const_char_ptr(n_buffer, (const char *)buffer, 1);
        des_int(n_size, size, 2);
        des_filepath(n_URL, URL, 3);
        des_const_char_ptr(n_encoding, (const char *)encoding, 4);
        des_int(n_options, options, 5);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlCtxtReadMemory",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_buffer);
            printf(" %d", n_size);
            printf(" %d", n_URL);
            printf(" %d", n_encoding);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}